

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QList<QTextCharFormat> * __thiscall
QList<QTextCharFormat>::fill(QList<QTextCharFormat> *this,parameter_type t,qsizetype newSize)

{
  Data *pDVar1;
  QTextCharFormat *b;
  long lVar2;
  QTextFormat QVar3;
  qsizetype qVar4;
  char *pcVar5;
  __off_t __length;
  long in_FS_OFFSET;
  QArrayDataPointer<QTextCharFormat> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar1->super_QArrayData).alloc < newSize)) {
    qVar4 = QArrayDataPointer<QTextCharFormat>::detachCapacity(&this->d,newSize);
    local_48._0_16_ = QTypedArrayData<QTextCharFormat>::allocate(qVar4,KeepSize);
    local_48.size = 0;
    QtPrivate::QGenericArrayOps<QTextCharFormat>::copyAppend
              ((QGenericArrayOps<QTextCharFormat> *)&local_48,newSize,t);
    QVar3 = *(QTextFormat *)&this->d;
    (this->d).d = local_48.d;
    (this->d).ptr = local_48.ptr;
    qVar4 = (this->d).size;
    (this->d).size = local_48.size;
    local_48._0_16_ = QVar3;
    local_48.size = qVar4;
    QArrayDataPointer<QTextCharFormat>::~QArrayDataPointer(&local_48);
  }
  else {
    local_48.ptr = (QTextCharFormat *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::QTextFormat((QTextFormat *)&local_48,&t->super_QTextFormat);
    b = (this->d).ptr;
    pcVar5 = (char *)(this->d).size;
    if (newSize <= (long)pcVar5) {
      pcVar5 = (char *)newSize;
    }
    QtPrivate::QGenericArrayOps<QTextCharFormat>::assign
              ((QGenericArrayOps<QTextCharFormat> *)this,b,b + (long)pcVar5,t);
    lVar2 = (this->d).size;
    if (newSize - lVar2 == 0 || newSize < lVar2) {
      if (newSize < lVar2) {
        QtPrivate::QGenericArrayOps<QTextCharFormat>::truncate
                  ((QGenericArrayOps<QTextCharFormat> *)this,(char *)newSize,__length);
      }
    }
    else {
      QtPrivate::QGenericArrayOps<QTextCharFormat>::copyAppend
                ((QGenericArrayOps<QTextCharFormat> *)this,newSize - lVar2,(parameter_type)&local_48
                );
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}